

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

bool __thiscall
QArrayDataPointer<QCss::StyleSheet>::tryReadjustFreeSpace
          (QArrayDataPointer<QCss::StyleSheet> *this,GrowthPosition pos,qsizetype n,
          StyleSheet **data)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
    lVar4 = 0;
    lVar3 = 0;
    lVar5 = 0;
  }
  else {
    lVar3 = (pDVar1->super_QArrayData).alloc;
    lVar5 = (long)((long)this->ptr -
                  ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5
    ;
    lVar4 = lVar5 * -0x3333333333333333;
    lVar5 = (lVar3 - this->size) + lVar5 * 0x3333333333333333;
  }
  if ((pos == GrowsAtEnd) && (n <= lVar4)) {
    lVar2 = this->size * 3;
    lVar5 = 0;
    if (SBORROW8(lVar2,lVar3 * 2) != lVar2 + lVar3 * -2 < 0) {
LAB_003763a2:
      relocate(this,lVar5 - lVar4,data);
      return true;
    }
  }
  else if ((pos == GrowsAtBeginning) && (n <= lVar5)) {
    if (lVar3 <= this->size * 3) {
      return false;
    }
    lVar3 = (lVar3 - (this->size + n)) / 2;
    lVar5 = 0;
    if (0 < lVar3) {
      lVar5 = lVar3;
    }
    lVar5 = lVar5 + n;
    goto LAB_003763a2;
  }
  return false;
}

Assistant:

qsizetype constAllocatedCapacity() const noexcept { return d ? d->constAllocatedCapacity() : 0; }